

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializePromisePrototype
               (DynamicObject *promisePrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  bool bVar1;
  JavascriptLibrary *this;
  ScriptContext *this_00;
  RuntimeFunction **ppRVar2;
  ScriptConfiguration *this_01;
  JavascriptString *value;
  JavascriptMethod p_Var3;
  JavascriptFunction *pJVar4;
  ScriptContext *scriptContext;
  JavascriptLibrary *library;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *promisePrototype_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,promisePrototype,mode,4,0);
  this = RecyclableObject::GetLibrary(&promisePrototype->super_RecyclableObject);
  this_00 = RecyclableObject::GetScriptContext(&promisePrototype->super_RecyclableObject);
  ppRVar2 = Memory::WriteBarrierPtr::operator_cast_to_RuntimeFunction__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).promiseConstructor);
  AddMember(this,promisePrototype,0x67,*ppRVar2);
  this_01 = ScriptContext::GetConfig(this_00);
  bVar1 = ScriptConfiguration::IsES6ToStringTagEnabled(this_01);
  if (bVar1) {
    value = CreateStringFromCppLiteral<8ul>(this,(char16 (*) [8])L"Promise");
    AddMember(this,promisePrototype,0x1b,value,'\x02');
  }
  p_Var3 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)JavascriptPromise::EntryInfo::Catch);
  pJVar4 = AddFunctionToLibraryObject
                     (this,promisePrototype,0x5e,(FunctionInfo *)JavascriptPromise::EntryInfo::Catch
                      ,1,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptPromise::EntryInfo::Finally);
  pJVar4 = AddFunctionToLibraryObject
                     (this,promisePrototype,0x8a,
                      (FunctionInfo *)JavascriptPromise::EntryInfo::Finally,1,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var3,pJVar4);
  pJVar4 = EnsurePromiseThenFunction(this);
  AddMember(this,promisePrototype,0x169,pJVar4,'\x06');
  p_Var3 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)JavascriptPromise::EntryInfo::Then);
  pJVar4 = EnsurePromiseThenFunction(this);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var3,pJVar4);
  DynamicObject::SetHasNoEnumerableProperties(promisePrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializePromisePrototype(DynamicObject* promisePrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(promisePrototype, mode, 4);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterPromise
        // so that the update is in sync with profiler
        JavascriptLibrary* library = promisePrototype->GetLibrary();
        ScriptContext* scriptContext = promisePrototype->GetScriptContext();

        library->AddMember(promisePrototype, PropertyIds::constructor, library->promiseConstructor);
        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(promisePrototype, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("Promise")), PropertyConfigurable);
        }
        scriptContext->SetBuiltInLibraryFunction(JavascriptPromise::EntryInfo::Catch.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(promisePrototype, PropertyIds::catch_, &JavascriptPromise::EntryInfo::Catch, 1));

        scriptContext->SetBuiltInLibraryFunction(JavascriptPromise::EntryInfo::Finally.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(promisePrototype, PropertyIds::finally, &JavascriptPromise::EntryInfo::Finally, 1));

        library->AddMember(promisePrototype, PropertyIds::then, library->EnsurePromiseThenFunction(), PropertyBuiltInMethodDefaults);
        scriptContext->SetBuiltInLibraryFunction(JavascriptPromise::EntryInfo::Then.GetOriginalEntryPoint(), library->EnsurePromiseThenFunction());

        promisePrototype->SetHasNoEnumerableProperties(true);

        return true;
    }